

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

string * __thiscall
LinkedObjectFile::get_goal_string_abi_cxx11_(LinkedObjectFile *this,int seg,int word_idx)

{
  int iVar1;
  reference this_00;
  size_type sVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  char cword [4];
  value_type *word;
  int byte_offset;
  int word_offset;
  size_t i;
  LinkedWord *size_word;
  string result;
  size_type in_stack_ffffffffffffff28;
  allocator *paVar3;
  reference in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff50;
  string *__lhs;
  uint32_t local_88;
  allocator local_81;
  reference local_80;
  uint local_78;
  int local_74;
  ulong local_70;
  allocator local_61;
  reference local_60;
  undefined4 local_54;
  allocator local_4d [20];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  
  __lhs = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar1 = local_18 + 1;
  this_00 = std::
            vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
            ::operator[]((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          *)(in_RSI + 0x60),(long)local_14);
  sVar2 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(this_00);
  if (iVar1 < (int)sVar2) {
    std::
    vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
    ::operator[]((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  *)(in_RSI + 0x60),(long)local_14);
    local_60 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                         ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (local_60->kind == PLAIN_DATA) {
      for (local_70 = 0; local_70 < local_60->data; local_70 = local_70 + 1) {
        local_74 = local_18 + 2 + (int)(local_70 >> 2);
        local_78 = (uint)local_70 & 3;
        std::
        vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
        ::operator[]((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                      *)(in_RSI + 0x60),(long)local_14);
        in_stack_ffffffffffffff30 =
             std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                       ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)in_stack_ffffffffffffff30
                        ,in_stack_ffffffffffffff28);
        local_80 = in_stack_ffffffffffffff30;
        if (in_stack_ffffffffffffff30->kind != PLAIN_DATA) {
          paVar3 = &local_81;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(__lhs,"invalid string! (check me!)\n",paVar3);
          std::allocator<char>::~allocator((allocator<char> *)&local_81);
          goto LAB_001aceae;
        }
        local_88 = in_stack_ffffffffffffff30->data;
        std::__cxx11::string::operator+=(local_38,*(char *)((long)&local_88 + (long)(int)local_78));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(__lhs,"invalid string!\n",&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(__lhs,"invalid string!\n",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
LAB_001aceae:
  local_54 = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string LinkedObjectFile::get_goal_string(int seg, int word_idx) {
  std::string result = "\"";
  // next should be the size
  if (word_idx + 1 >= int(words_by_seg[seg].size())) {
    return "invalid string!\n";
  }
  LinkedWord& size_word = words_by_seg[seg].at(word_idx + 1);
  if (size_word.kind != LinkedWord::PLAIN_DATA) {
    // sometimes an array of string pointer triggers this!
    return "invalid string!\n";
  }

  //  result += "(size " + std::to_string(size_word.data) + "): ";
  // now characters...
  for (size_t i = 0; i < size_word.data; i++) {
    int word_offset = word_idx + 2 + (i / 4);
    int byte_offset = i % 4;
    auto& word = words_by_seg[seg].at(word_offset);
    if (word.kind != LinkedWord::PLAIN_DATA) {
      return "invalid string! (check me!)\n";
    }
    char cword[4];
    memcpy(cword, &word.data, 4);
    result += cword[byte_offset];
  }
  return result + "\"";
}